

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gc_function.h
# Opt level: O3

value * __thiscall
mjs::gc_function::
impl<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/mras0[P]mjs/src/mjs.cpp:62:49)>::
call(value *__return_storage_ptr__,
    impl<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_mras0[P]mjs_src_mjs_cpp:62:49)>
    *this,value *this_,vector<mjs::value,_std::allocator<mjs::value>_> *args)

{
  pointer pvVar1;
  interpreter *i;
  uint *puVar2;
  native_error_exception *this_00;
  global_object *this_01;
  wstring_view path;
  gc_heap_ptr_untyped gStack_68;
  wstring local_58;
  string_view local_38;
  wstring_view local_28;
  
  pvVar1 = (args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
           super__Vector_impl_data._M_start;
  if (((long)(args->super__Vector_base<mjs::value,_std::allocator<mjs::value>_>)._M_impl.
             super__Vector_impl_data._M_finish - (long)pvVar1 == 0x28) && (pvVar1->type_ == string))
  {
    i = (this->f).i;
    puVar2 = (uint *)gc_heap_ptr_untyped::get((gc_heap_ptr_untyped *)&(pvVar1->field_1).s_);
    path._M_len = (ulong)*puVar2;
    path._M_str = (wchar_t *)(puVar2 + 1);
    load_file(__return_storage_ptr__,i,path);
    return __return_storage_ptr__;
  }
  this_00 = (native_error_exception *)__cxa_allocate_exception(0x58);
  interpreter::global((interpreter *)&gStack_68);
  this_01 = (global_object *)gc_heap_ptr_untyped::get(&gStack_68);
  global_object::stack_trace_abi_cxx11_(&local_58,this_01);
  local_28._M_len = local_58._M_string_length;
  local_28._M_str = local_58._M_dataplus._M_p;
  local_38._M_len = 0x15;
  local_38._M_str = "path must be a string";
  native_error_exception::native_error_exception(this_00,eval,&local_28,&local_38);
  __cxa_throw(this_00,&native_error_exception::typeinfo,
              native_error_exception::~native_error_exception);
}

Assistant:

value call(const value& this_, const std::vector<value>& args) override { return f(this_, args); }